

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttp2connection_p.h
# Opt level: O1

QByteDataBuffer * __thiscall
QHttp2Stream::takeDownloadBuffer(QByteDataBuffer *__return_storage_ptr__,QHttp2Stream *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  QByteArray *pQVar3;
  qint64 qVar4;
  QByteDataBuffer *__old_val;
  long in_FS_OFFSET;
  QArrayDataPointer<QByteArray> local_68;
  undefined8 uStack_50;
  undefined8 local_48;
  QArrayDataPointer<QByteArray> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_48 = 0;
  uStack_50 = 0;
  (__return_storage_ptr__->buffers).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->buffers).d.ptr = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->buffers).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->bufferCompleteSize = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->firstPos = (qint64)&DAT_aaaaaaaaaaaaaaaa;
  pDVar2 = *(Data **)(this + 0x40);
  pQVar3 = *(QByteArray **)(this + 0x48);
  *(undefined8 *)(this + 0x40) = 0;
  *(undefined8 *)(this + 0x48) = 0;
  (__return_storage_ptr__->buffers).d.d = pDVar2;
  (__return_storage_ptr__->buffers).d.ptr = pQVar3;
  qVar1 = *(qsizetype *)(this + 0x50);
  *(undefined8 *)(this + 0x50) = 0;
  (__return_storage_ptr__->buffers).d.size = qVar1;
  qVar4 = *(qint64 *)(this + 0x60);
  __return_storage_ptr__->bufferCompleteSize = *(qint64 *)(this + 0x58);
  __return_storage_ptr__->firstPos = qVar4;
  local_68.d = (Data *)0x0;
  local_68.ptr = (QByteArray *)0x0;
  local_68.size = 0;
  *(undefined8 *)(this + 0x40) = 0;
  local_38.d = (Data *)0x0;
  *(undefined8 *)(this + 0x48) = 0;
  local_38.ptr = (QByteArray *)0x0;
  *(undefined8 *)(this + 0x50) = 0;
  local_38.size = 0;
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_38);
  *(undefined8 *)(this + 0x58) = uStack_50;
  *(undefined8 *)(this + 0x60) = local_48;
  QArrayDataPointer<QByteArray>::~QArrayDataPointer(&local_68);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteDataBuffer takeDownloadBuffer() noexcept { return std::exchange(m_downloadBuffer, {}); }